

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O3

void idct32x32_low8_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  undefined1 auVar18 [16];
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  int iVar50;
  int iVar51;
  int iVar52;
  uint uVar53;
  int iVar58;
  uint uVar59;
  int iVar60;
  uint uVar61;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  int iVar62;
  uint uVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  uint uVar70;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  uint uVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  uint uVar87;
  undefined1 auVar71 [16];
  int iVar88;
  int iVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  int iVar93;
  int iVar94;
  uint uVar95;
  int iVar96;
  int iVar102;
  int iVar104;
  undefined1 auVar98 [16];
  int iVar106;
  undefined1 auVar99 [16];
  int iVar97;
  int iVar103;
  int iVar105;
  int iVar107;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  int iVar108;
  uint uVar109;
  int iVar113;
  uint uVar114;
  int iVar115;
  uint uVar116;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  int iVar117;
  uint uVar118;
  uint uVar119;
  uint uVar126;
  uint uVar127;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  uint uVar128;
  undefined1 auVar125 [16];
  int iVar129;
  int iVar130;
  uint uVar131;
  int iVar142;
  int iVar145;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  int iVar148;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  int iVar143;
  int iVar146;
  int iVar149;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  uint uVar144;
  uint uVar147;
  uint uVar150;
  undefined1 auVar141 [16];
  int iVar151;
  int iVar155;
  int iVar156;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  int iVar157;
  int iVar158;
  uint uVar159;
  int iVar166;
  int iVar168;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  int iVar170;
  undefined1 auVar163 [16];
  uint uVar167;
  uint uVar169;
  uint uVar171;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  int iVar172;
  int iVar173;
  uint uVar174;
  int iVar177;
  int iVar178;
  int iVar180;
  int iVar181;
  int iVar183;
  int iVar184;
  undefined1 auVar175 [16];
  uint uVar179;
  uint uVar182;
  uint uVar185;
  undefined1 auVar176 [16];
  int iVar186;
  uint uVar187;
  int iVar196;
  int iVar198;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  int iVar200;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  uint uVar197;
  uint uVar199;
  uint uVar201;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  int iVar202;
  int iVar208;
  int iVar209;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  int iVar210;
  int iVar211;
  uint uVar212;
  uint uVar213;
  int iVar221;
  int iVar224;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  uint uVar222;
  uint uVar225;
  int iVar227;
  uint uVar228;
  undefined1 auVar218 [16];
  uint uVar223;
  uint uVar226;
  uint uVar229;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  __m128i clamp_hi;
  __m128i clamp_lo;
  int local_4d8;
  int iStack_4d4;
  int iStack_4d0;
  int iStack_4cc;
  int local_4c8;
  int iStack_4c4;
  int iStack_4c0;
  int iStack_4bc;
  undefined1 local_478 [16];
  int local_408;
  int iStack_404;
  int iStack_400;
  int iStack_3fc;
  int local_3c8;
  int iStack_3c4;
  int iStack_3c0;
  int iStack_3bc;
  int local_3b8;
  int iStack_3b4;
  int iStack_3b0;
  int iStack_3ac;
  int local_3a8;
  int iStack_3a4;
  int iStack_3a0;
  int iStack_39c;
  int local_258;
  int iStack_254;
  int iStack_250;
  int iStack_24c;
  int local_248;
  int iStack_244;
  int iStack_240;
  int iStack_23c;
  uint local_238;
  uint uStack_234;
  uint uStack_230;
  uint uStack_22c;
  uint local_228;
  uint uStack_224;
  uint uStack_220;
  uint uStack_21c;
  uint local_218;
  uint uStack_214;
  uint uStack_210;
  uint uStack_20c;
  uint local_208;
  uint uStack_204;
  uint uStack_200;
  uint uStack_1fc;
  uint local_1f8;
  uint uStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  uint local_1e8;
  uint uStack_1e4;
  uint uStack_1e0;
  uint uStack_1dc;
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint local_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint local_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  uint local_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint local_188;
  uint uStack_184;
  uint uStack_180;
  uint uStack_17c;
  uint local_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint local_168;
  uint uStack_164;
  uint uStack_160;
  uint uStack_15c;
  uint local_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint local_148;
  uint uStack_144;
  uint uStack_140;
  uint uStack_13c;
  uint local_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint local_128;
  uint uStack_124;
  uint uStack_120;
  uint uStack_11c;
  uint local_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint local_108;
  uint uStack_104;
  uint uStack_100;
  uint uStack_fc;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  lVar9 = (long)bit * 0x100;
  iVar227 = -*(int *)((long)vert_filter_length_chroma + lVar9 + 0x248);
  iVar16 = -*(int *)((long)vert_filter_length_chroma + lVar9 + 0x228);
  iVar17 = -*(int *)((long)vert_filter_length_chroma + lVar9 + 0x230);
  iVar15 = *(int *)((long)vert_filter_length_chroma + lVar9 + 0x240);
  iVar19 = *(int *)((long)vert_filter_length_chroma + lVar9 + 0x1c0);
  iVar25 = *(int *)((long)vert_filter_length_chroma + lVar9 + 0x200);
  iVar33 = *(int *)((long)vert_filter_length_chroma + lVar9 + 0x180);
  iVar11 = -iVar25;
  iVar6 = -iVar33;
  iVar8 = -iVar15;
  iVar5 = -iVar19;
  iVar211 = *(int *)((long)vert_filter_length_chroma + lVar9 + 0x1e0);
  iVar2 = -iVar211;
  iVar221 = *(int *)((long)vert_filter_length_chroma + lVar9 + 0x220);
  iVar3 = -iVar221;
  iVar224 = *(int *)((long)vert_filter_length_chroma + lVar9 + 0x1a0);
  iVar7 = 1 << ((char)bit - 1U & 0x1f);
  iVar10 = -iVar224;
  iVar4 = bd + 6 + (uint)(do_cols == 0) * 2;
  local_258 = 0x8000;
  if (0xf < iVar4) {
    local_258 = 1 << ((char)iVar4 - 1U & 0x1f);
  }
  local_248 = -local_258;
  local_258 = local_258 + -1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar9 + 600);
  auVar203._4_4_ = uVar1;
  auVar203._0_4_ = uVar1;
  auVar203._8_4_ = uVar1;
  auVar203._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar9 + 0x198);
  auVar43._4_4_ = uVar1;
  auVar43._0_4_ = uVar1;
  auVar43._8_4_ = uVar1;
  auVar43._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar9 + 0x238);
  auVar217._4_4_ = uVar1;
  auVar217._0_4_ = uVar1;
  auVar217._8_4_ = uVar1;
  auVar217._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar9 + 0x178);
  auVar71._4_4_ = uVar1;
  auVar71._0_4_ = uVar1;
  auVar71._8_4_ = uVar1;
  auVar71._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar9 + 0x188);
  auVar132._4_4_ = uVar1;
  auVar132._0_4_ = uVar1;
  auVar132._8_4_ = uVar1;
  auVar132._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar9 + 0x168);
  auVar188._4_4_ = uVar1;
  auVar188._0_4_ = uVar1;
  auVar188._8_4_ = uVar1;
  auVar188._12_4_ = uVar1;
  auVar152._4_4_ = iVar227;
  auVar152._0_4_ = iVar227;
  auVar152._8_4_ = iVar227;
  auVar152._12_4_ = iVar227;
  auVar214._4_4_ = iVar16;
  auVar214._0_4_ = iVar16;
  auVar214._8_4_ = iVar16;
  auVar214._12_4_ = iVar16;
  auVar189 = pmulld(auVar188,(undefined1  [16])in[1]);
  auVar204 = pmulld(auVar203,(undefined1  [16])in[1]);
  auVar215 = pmulld(auVar214,(undefined1  [16])in[7]);
  auVar18 = pmulld(auVar43,(undefined1  [16])in[7]);
  auVar133 = pmulld(auVar132,(undefined1  [16])in[5]);
  auVar120 = pmulld(auVar217,(undefined1  [16])in[5]);
  auVar153 = pmulld(auVar152,(undefined1  [16])in[3]);
  auVar54 = pmulld(auVar71,(undefined1  [16])in[3]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar9 + 0x250);
  auVar45._4_4_ = uVar1;
  auVar45._0_4_ = uVar1;
  auVar45._8_4_ = uVar1;
  auVar45._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar9 + 0x170);
  auVar98._4_4_ = uVar1;
  auVar98._0_4_ = uVar1;
  auVar98._8_4_ = uVar1;
  auVar98._12_4_ = uVar1;
  auVar55 = pmulld(auVar98,(undefined1  [16])in[2]);
  auVar43 = pmulld(auVar45,(undefined1  [16])in[2]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar9 + 400);
  auVar13._4_4_ = uVar1;
  auVar13._0_4_ = uVar1;
  auVar13._8_4_ = uVar1;
  auVar13._12_4_ = uVar1;
  auVar56._4_4_ = iVar17;
  auVar56._0_4_ = iVar17;
  auVar56._8_4_ = iVar17;
  auVar56._12_4_ = iVar17;
  auVar44 = pmulld(auVar56,(undefined1  [16])in[6]);
  auVar12 = pmulld(auVar13,(undefined1  [16])in[6]);
  auVar100._4_4_ = iVar15;
  auVar100._0_4_ = iVar15;
  auVar100._8_4_ = iVar15;
  auVar100._12_4_ = iVar15;
  auVar14._4_4_ = iVar6;
  auVar14._0_4_ = iVar6;
  auVar14._8_4_ = iVar6;
  auVar14._12_4_ = iVar6;
  auVar45 = ZEXT416((uint)bit);
  auVar190._0_4_ = auVar189._0_4_ + iVar7 >> auVar45;
  auVar190._4_4_ = auVar189._4_4_ + iVar7 >> auVar45;
  auVar190._8_4_ = auVar189._8_4_ + iVar7 >> auVar45;
  auVar190._12_4_ = auVar189._12_4_ + iVar7 >> auVar45;
  auVar205._0_4_ = auVar204._0_4_ + iVar7 >> auVar45;
  auVar205._4_4_ = auVar204._4_4_ + iVar7 >> auVar45;
  auVar205._8_4_ = auVar204._8_4_ + iVar7 >> auVar45;
  auVar205._12_4_ = auVar204._12_4_ + iVar7 >> auVar45;
  auVar110 = pmulld(auVar205,auVar14);
  auVar98 = pmulld(auVar190,auVar100);
  auVar112._4_4_ = iVar33;
  auVar112._0_4_ = iVar33;
  auVar112._8_4_ = iVar33;
  auVar112._12_4_ = iVar33;
  auVar111 = pmulld(auVar205,auVar100);
  auVar71 = pmulld(auVar112,auVar190);
  auVar154._4_4_ = iVar8;
  auVar154._0_4_ = iVar8;
  auVar154._8_4_ = iVar8;
  auVar154._12_4_ = iVar8;
  auVar216._0_4_ = auVar215._0_4_ + iVar7 >> auVar45;
  auVar216._4_4_ = auVar215._4_4_ + iVar7 >> auVar45;
  auVar216._8_4_ = auVar215._8_4_ + iVar7 >> auVar45;
  auVar216._12_4_ = auVar215._12_4_ + iVar7 >> auVar45;
  auVar189._0_4_ = auVar18._0_4_ + iVar7 >> auVar45;
  auVar189._4_4_ = auVar18._4_4_ + iVar7 >> auVar45;
  auVar189._8_4_ = auVar18._8_4_ + iVar7 >> auVar45;
  auVar189._12_4_ = auVar18._12_4_ + iVar7 >> auVar45;
  auVar206 = pmulld(auVar112,(undefined1  [16])in[4]);
  auVar13 = pmulld((undefined1  [16])in[4],auVar100);
  auVar112 = pmulld(auVar154,auVar216);
  auVar215 = pmulld(auVar100,auVar189);
  iVar96 = auVar189._0_4_ + auVar190._0_4_;
  iVar102 = auVar189._4_4_ + auVar190._4_4_;
  iVar104 = auVar189._8_4_ + auVar190._8_4_;
  iVar106 = auVar189._12_4_ + auVar190._12_4_;
  iVar186 = auVar190._0_4_ - auVar189._0_4_;
  iVar196 = auVar190._4_4_ - auVar189._4_4_;
  iVar198 = auVar190._8_4_ - auVar189._8_4_;
  iVar200 = auVar190._12_4_ - auVar189._12_4_;
  auVar204 = pmulld(auVar189,auVar14);
  auVar14 = pmulld(auVar14,auVar216);
  auVar160._4_4_ = iVar19;
  auVar160._0_4_ = iVar19;
  auVar160._8_4_ = iVar19;
  auVar160._12_4_ = iVar19;
  auVar134._0_4_ = auVar133._0_4_ + iVar7 >> auVar45;
  auVar134._4_4_ = auVar133._4_4_ + iVar7 >> auVar45;
  auVar134._8_4_ = auVar133._8_4_ + iVar7 >> auVar45;
  auVar134._12_4_ = auVar133._12_4_ + iVar7 >> auVar45;
  auVar121._0_4_ = auVar120._0_4_ + iVar7 >> auVar45;
  auVar121._4_4_ = auVar120._4_4_ + iVar7 >> auVar45;
  auVar121._8_4_ = auVar120._8_4_ + iVar7 >> auVar45;
  auVar121._12_4_ = auVar120._12_4_ + iVar7 >> auVar45;
  auVar120._4_4_ = iVar11;
  auVar120._0_4_ = iVar11;
  auVar120._8_4_ = iVar11;
  auVar120._12_4_ = iVar11;
  auVar217 = pmulld(auVar121,auVar120);
  auVar133 = pmulld(auVar134,auVar160);
  auVar161._4_4_ = iVar25;
  auVar161._0_4_ = iVar25;
  auVar161._8_4_ = iVar25;
  auVar161._12_4_ = iVar25;
  auVar191._4_4_ = iVar5;
  auVar191._0_4_ = iVar5;
  auVar191._8_4_ = iVar5;
  auVar191._12_4_ = iVar5;
  auVar99._0_4_ = auVar153._0_4_ + iVar7 >> auVar45;
  auVar99._4_4_ = auVar153._4_4_ + iVar7 >> auVar45;
  auVar99._8_4_ = auVar153._8_4_ + iVar7 >> auVar45;
  auVar99._12_4_ = auVar153._12_4_ + iVar7 >> auVar45;
  local_4c8 = auVar54._0_4_;
  iStack_4c4 = auVar54._4_4_;
  iStack_4c0 = auVar54._8_4_;
  iStack_4bc = auVar54._12_4_;
  auVar135._0_4_ = local_4c8 + iVar7 >> auVar45;
  auVar135._4_4_ = iStack_4c4 + iVar7 >> auVar45;
  auVar135._8_4_ = iStack_4c0 + iVar7 >> auVar45;
  auVar135._12_4_ = iStack_4bc + iVar7 >> auVar45;
  auVar192 = pmulld(auVar191,auVar99);
  auVar154 = pmulld(auVar135,auVar120);
  auVar120 = pmulld(auVar120,auVar99);
  iVar129 = auVar121._0_4_ + auVar99._0_4_;
  iVar142 = auVar121._4_4_ + auVar99._4_4_;
  iVar145 = auVar121._8_4_ + auVar99._8_4_;
  iVar148 = auVar121._12_4_ + auVar99._12_4_;
  iVar97 = auVar99._0_4_ - auVar121._0_4_;
  iVar103 = auVar99._4_4_ - auVar121._4_4_;
  iVar105 = auVar99._8_4_ - auVar121._8_4_;
  iVar107 = auVar99._12_4_ - auVar121._12_4_;
  auVar122 = pmulld(auVar121,auVar160);
  auVar56 = pmulld(auVar161,auVar134);
  auVar161 = pmulld(auVar160,auVar135);
  auVar162._4_4_ = iVar221;
  auVar162._0_4_ = iVar221;
  auVar162._8_4_ = iVar221;
  auVar162._12_4_ = iVar221;
  local_3a8 = auVar55._0_4_;
  iStack_3a4 = auVar55._4_4_;
  iStack_3a0 = auVar55._8_4_;
  iStack_39c = auVar55._12_4_;
  auVar136._0_4_ = local_3a8 + iVar7 >> auVar45;
  auVar136._4_4_ = iStack_3a4 + iVar7 >> auVar45;
  auVar136._8_4_ = iStack_3a0 + iVar7 >> auVar45;
  auVar136._12_4_ = iStack_39c + iVar7 >> auVar45;
  local_4d8 = auVar43._0_4_;
  iStack_4d4 = auVar43._4_4_;
  iStack_4d0 = auVar43._8_4_;
  iStack_4cc = auVar43._12_4_;
  auVar124._0_4_ = local_4d8 + iVar7 >> auVar45;
  auVar124._4_4_ = iStack_4d4 + iVar7 >> auVar45;
  auVar124._8_4_ = iStack_4d0 + iVar7 >> auVar45;
  auVar124._12_4_ = iStack_4cc + iVar7 >> auVar45;
  auVar18._4_4_ = iVar10;
  auVar18._0_4_ = iVar10;
  auVar18._8_4_ = iVar10;
  auVar18._12_4_ = iVar10;
  auVar100 = pmulld(auVar124,auVar18);
  auVar43 = pmulld(auVar136,auVar162);
  auVar54._4_4_ = iVar224;
  auVar54._0_4_ = iVar224;
  auVar54._8_4_ = iVar224;
  auVar54._12_4_ = iVar224;
  auVar153 = pmulld(auVar124,auVar162);
  auVar137 = pmulld(auVar136,auVar54);
  auVar55._4_4_ = iVar3;
  auVar55._0_4_ = iVar3;
  auVar55._8_4_ = iVar3;
  auVar55._12_4_ = iVar3;
  local_408 = auVar44._0_4_;
  iStack_404 = auVar44._4_4_;
  iStack_400 = auVar44._8_4_;
  iStack_3fc = auVar44._12_4_;
  auVar101._0_4_ = local_408 + iVar7 >> auVar45;
  auVar101._4_4_ = iStack_404 + iVar7 >> auVar45;
  auVar101._8_4_ = iStack_400 + iVar7 >> auVar45;
  auVar101._12_4_ = iStack_3fc + iVar7 >> auVar45;
  local_3b8 = auVar12._0_4_;
  iStack_3b4 = auVar12._4_4_;
  iStack_3b0 = auVar12._8_4_;
  iStack_3ac = auVar12._12_4_;
  auVar193._0_4_ = local_3b8 + iVar7 >> auVar45;
  auVar193._4_4_ = iStack_3b4 + iVar7 >> auVar45;
  auVar193._8_4_ = iStack_3b0 + iVar7 >> auVar45;
  auVar193._12_4_ = iStack_3ac + iVar7 >> auVar45;
  auVar44 = pmulld(auVar101,auVar55);
  auVar189 = pmulld(auVar193,auVar18);
  auVar57._4_4_ = iVar211;
  auVar57._0_4_ = iVar211;
  auVar57._8_4_ = iVar211;
  auVar57._12_4_ = iVar211;
  auVar12 = pmulld((undefined1  [16])*in,auVar57);
  auVar207._0_4_ = auVar206._0_4_ + iVar7 >> auVar45;
  auVar207._4_4_ = auVar206._4_4_ + iVar7 >> auVar45;
  auVar207._8_4_ = auVar206._8_4_ + iVar7 >> auVar45;
  auVar207._12_4_ = auVar206._12_4_ + iVar7 >> auVar45;
  local_3c8 = auVar13._0_4_;
  iStack_3c4 = auVar13._4_4_;
  iStack_3c0 = auVar13._8_4_;
  iStack_3bc = auVar13._12_4_;
  auVar206._0_4_ = local_3c8 + iVar7 >> auVar45;
  auVar206._4_4_ = iStack_3c4 + iVar7 >> auVar45;
  auVar206._8_4_ = iStack_3c0 + iVar7 >> auVar45;
  auVar206._12_4_ = iStack_3bc + iVar7 >> auVar45;
  iVar8 = auVar12._0_4_ + iVar7 >> auVar45;
  iVar72 = auVar12._4_4_ + iVar7 >> auVar45;
  iVar80 = auVar12._8_4_ + iVar7 >> auVar45;
  iVar88 = auVar12._12_4_ + iVar7 >> auVar45;
  iVar64 = auVar193._0_4_ + auVar136._0_4_;
  iVar73 = auVar193._4_4_ + auVar136._4_4_;
  iVar81 = auVar193._8_4_ + auVar136._8_4_;
  iVar89 = auVar193._12_4_ + auVar136._12_4_;
  iVar172 = auVar136._0_4_ - auVar193._0_4_;
  iVar177 = auVar136._4_4_ - auVar193._4_4_;
  iVar180 = auVar136._8_4_ - auVar193._8_4_;
  iVar183 = auVar136._12_4_ - auVar193._12_4_;
  auVar13 = pmulld(auVar101,auVar18);
  auVar12 = pmulld(auVar193,auVar162);
  iVar130 = auVar216._0_4_ + auVar205._0_4_;
  iVar143 = auVar216._4_4_ + auVar205._4_4_;
  iVar146 = auVar216._8_4_ + auVar205._8_4_;
  iVar149 = auVar216._12_4_ + auVar205._12_4_;
  iVar65 = auVar205._0_4_ - auVar216._0_4_;
  iVar74 = auVar205._4_4_ - auVar216._4_4_;
  iVar82 = auVar205._8_4_ - auVar216._8_4_;
  iVar90 = auVar205._12_4_ - auVar216._12_4_;
  iVar66 = auVar110._0_4_ + iVar7 + auVar98._0_4_ >> auVar45;
  iVar75 = auVar110._4_4_ + iVar7 + auVar98._4_4_ >> auVar45;
  iVar83 = auVar110._8_4_ + iVar7 + auVar98._8_4_ >> auVar45;
  iVar91 = auVar110._12_4_ + iVar7 + auVar98._12_4_ >> auVar45;
  iVar15 = auVar204._0_4_ + iVar7 + auVar112._0_4_ >> auVar45;
  iVar19 = auVar204._4_4_ + iVar7 + auVar112._4_4_ >> auVar45;
  iVar25 = auVar204._8_4_ + iVar7 + auVar112._8_4_ >> auVar45;
  iVar33 = auVar204._12_4_ + iVar7 + auVar112._12_4_ >> auVar45;
  iVar211 = auVar217._0_4_ + iVar7 + auVar133._0_4_ >> auVar45;
  iVar221 = auVar217._4_4_ + iVar7 + auVar133._4_4_ >> auVar45;
  iVar224 = auVar217._8_4_ + iVar7 + auVar133._8_4_ >> auVar45;
  iVar227 = auVar217._12_4_ + iVar7 + auVar133._12_4_ >> auVar45;
  iVar151 = auVar154._0_4_ + iVar7 + auVar192._0_4_ >> auVar45;
  iVar155 = auVar154._4_4_ + iVar7 + auVar192._4_4_ >> auVar45;
  iVar156 = auVar154._8_4_ + iVar7 + auVar192._8_4_ >> auVar45;
  iVar157 = auVar154._12_4_ + iVar7 + auVar192._12_4_ >> auVar45;
  iVar108 = iVar15 + iVar66;
  iVar113 = iVar19 + iVar75;
  iVar115 = iVar25 + iVar83;
  iVar117 = iVar33 + iVar91;
  iVar66 = iVar66 - iVar15;
  iVar75 = iVar75 - iVar19;
  iVar83 = iVar83 - iVar25;
  iVar91 = iVar91 - iVar33;
  iVar16 = iVar151 + iVar211;
  iVar10 = iVar155 + iVar221;
  iVar26 = iVar156 + iVar224;
  iVar34 = iVar157 + iVar227;
  iVar151 = iVar151 - iVar211;
  iVar155 = iVar155 - iVar221;
  iVar156 = iVar156 - iVar224;
  iVar157 = iVar157 - iVar227;
  iVar15 = auVar122._0_4_ + iVar7 + auVar56._0_4_ >> auVar45;
  iVar19 = auVar122._4_4_ + iVar7 + auVar56._4_4_ >> auVar45;
  iVar25 = auVar122._8_4_ + iVar7 + auVar56._8_4_ >> auVar45;
  iVar33 = auVar122._12_4_ + iVar7 + auVar56._12_4_ >> auVar45;
  iVar17 = auVar134._0_4_ + auVar135._0_4_;
  iVar11 = auVar134._4_4_ + auVar135._4_4_;
  iVar27 = auVar134._8_4_ + auVar135._8_4_;
  iVar35 = auVar134._12_4_ + auVar135._12_4_;
  iVar67 = auVar135._0_4_ - auVar134._0_4_;
  iVar76 = auVar135._4_4_ - auVar134._4_4_;
  iVar84 = auVar135._8_4_ - auVar134._8_4_;
  iVar92 = auVar135._12_4_ - auVar134._12_4_;
  iVar68 = auVar161._0_4_ + iVar7 + auVar120._0_4_ >> auVar45;
  iVar77 = auVar161._4_4_ + iVar7 + auVar120._4_4_ >> auVar45;
  iVar85 = auVar161._8_4_ + iVar7 + auVar120._8_4_ >> auVar45;
  iVar93 = auVar161._12_4_ + iVar7 + auVar120._12_4_ >> auVar45;
  iVar3 = iVar68 + iVar15;
  iVar20 = iVar77 + iVar19;
  iVar28 = iVar85 + iVar25;
  iVar36 = iVar93 + iVar33;
  iVar68 = iVar68 - iVar15;
  iVar77 = iVar77 - iVar19;
  iVar85 = iVar85 - iVar25;
  iVar93 = iVar93 - iVar33;
  iVar69 = auVar111._0_4_ + iVar7 + auVar71._0_4_ >> auVar45;
  iVar78 = auVar111._4_4_ + iVar7 + auVar71._4_4_ >> auVar45;
  iVar86 = auVar111._8_4_ + iVar7 + auVar71._8_4_ >> auVar45;
  iVar94 = auVar111._12_4_ + iVar7 + auVar71._12_4_ >> auVar45;
  iVar15 = auVar215._0_4_ + iVar7 + auVar14._0_4_ >> auVar45;
  iVar19 = auVar215._4_4_ + iVar7 + auVar14._4_4_ >> auVar45;
  iVar25 = auVar215._8_4_ + iVar7 + auVar14._8_4_ >> auVar45;
  iVar33 = auVar215._12_4_ + iVar7 + auVar14._12_4_ >> auVar45;
  iVar41 = iVar15 + iVar69;
  iVar46 = iVar19 + iVar78;
  iVar48 = iVar25 + iVar86;
  iVar50 = iVar33 + iVar94;
  iVar69 = iVar69 - iVar15;
  iVar78 = iVar78 - iVar19;
  iVar86 = iVar86 - iVar25;
  iVar94 = iVar94 - iVar33;
  auVar138._4_4_ = iVar2;
  auVar138._0_4_ = iVar2;
  auVar138._8_4_ = iVar2;
  auVar138._12_4_ = iVar2;
  iVar2 = iVar8 - auVar207._0_4_;
  iVar21 = iVar72 - auVar207._4_4_;
  iVar29 = iVar80 - auVar207._8_4_;
  iVar37 = iVar88 - auVar207._12_4_;
  iVar202 = auVar207._0_4_ + iVar8;
  iVar208 = auVar207._4_4_ + iVar72;
  iVar209 = auVar207._8_4_ + iVar80;
  iVar210 = auVar207._12_4_ + iVar88;
  iVar4 = auVar206._0_4_ + iVar8;
  iVar22 = auVar206._4_4_ + iVar72;
  iVar30 = auVar206._8_4_ + iVar80;
  iVar38 = auVar206._12_4_ + iVar88;
  iVar52 = iVar8 - auVar206._0_4_;
  iVar58 = iVar72 - auVar206._4_4_;
  iVar60 = iVar80 - auVar206._8_4_;
  iVar62 = iVar88 - auVar206._12_4_;
  auVar161 = pmulld(auVar206,auVar138);
  auVar133 = pmulld(auVar207,auVar57);
  iVar5 = auVar101._0_4_ + auVar124._0_4_;
  iVar23 = auVar101._4_4_ + auVar124._4_4_;
  iVar31 = auVar101._8_4_ + auVar124._8_4_;
  iVar39 = auVar101._12_4_ + auVar124._12_4_;
  iVar158 = auVar124._0_4_ - auVar101._0_4_;
  iVar166 = auVar124._4_4_ - auVar101._4_4_;
  iVar168 = auVar124._8_4_ - auVar101._8_4_;
  iVar170 = auVar124._12_4_ - auVar101._12_4_;
  iVar173 = auVar100._0_4_ + iVar7 + auVar43._0_4_ >> auVar45;
  iVar178 = auVar100._4_4_ + iVar7 + auVar43._4_4_ >> auVar45;
  iVar181 = auVar100._8_4_ + iVar7 + auVar43._8_4_ >> auVar45;
  iVar184 = auVar100._12_4_ + iVar7 + auVar43._12_4_ >> auVar45;
  iVar42 = auVar153._0_4_ + iVar7 + auVar137._0_4_ >> auVar45;
  iVar47 = auVar153._4_4_ + iVar7 + auVar137._4_4_ >> auVar45;
  iVar49 = auVar153._8_4_ + iVar7 + auVar137._8_4_ >> auVar45;
  iVar51 = auVar153._12_4_ + iVar7 + auVar137._12_4_ >> auVar45;
  iVar211 = auVar189._0_4_ + iVar7 + auVar44._0_4_ >> auVar45;
  iVar221 = auVar189._4_4_ + iVar7 + auVar44._4_4_ >> auVar45;
  iVar224 = auVar189._8_4_ + iVar7 + auVar44._8_4_ >> auVar45;
  iVar227 = auVar189._12_4_ + iVar7 + auVar44._12_4_ >> auVar45;
  iVar15 = auVar12._0_4_ + iVar7 + auVar13._0_4_ >> auVar45;
  iVar19 = auVar12._4_4_ + iVar7 + auVar13._4_4_ >> auVar45;
  iVar25 = auVar12._8_4_ + iVar7 + auVar13._8_4_ >> auVar45;
  iVar33 = auVar12._12_4_ + iVar7 + auVar13._12_4_ >> auVar45;
  iVar6 = iVar211 + iVar173;
  iVar24 = iVar221 + iVar178;
  iVar32 = iVar224 + iVar181;
  iVar40 = iVar227 + iVar184;
  iVar173 = iVar173 - iVar211;
  iVar178 = iVar178 - iVar221;
  iVar181 = iVar181 - iVar224;
  iVar184 = iVar184 - iVar227;
  iVar211 = iVar15 + iVar42;
  iVar221 = iVar19 + iVar47;
  iVar224 = iVar25 + iVar49;
  iVar227 = iVar33 + iVar51;
  iVar42 = iVar42 - iVar15;
  iVar47 = iVar47 - iVar19;
  iVar49 = iVar49 - iVar25;
  iVar51 = iVar51 - iVar33;
  uVar212 = (uint)(iVar66 < local_248) * local_248 | (uint)(iVar66 >= local_248) * iVar66;
  uVar222 = (uint)(iVar75 < local_248) * local_248 | (uint)(iVar75 >= local_248) * iVar75;
  uVar225 = (uint)(iVar83 < local_248) * local_248 | (uint)(iVar83 >= local_248) * iVar83;
  uVar228 = (uint)(iVar91 < local_248) * local_248 | (uint)(iVar91 >= local_248) * iVar91;
  auVar218._0_4_ =
       (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  auVar218._4_4_ =
       (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  auVar218._8_4_ =
       (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  auVar218._12_4_ =
       (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  uVar212 = (uint)(iVar69 < local_248) * local_248 | (uint)(iVar69 >= local_248) * iVar69;
  uVar222 = (uint)(iVar78 < local_248) * local_248 | (uint)(iVar78 >= local_248) * iVar78;
  uVar225 = (uint)(iVar86 < local_248) * local_248 | (uint)(iVar86 >= local_248) * iVar86;
  uVar228 = (uint)(iVar94 < local_248) * local_248 | (uint)(iVar94 >= local_248) * iVar94;
  auVar204._0_4_ =
       (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  auVar204._4_4_ =
       (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  auVar204._8_4_ =
       (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  auVar204._12_4_ =
       (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  auVar56 = pmulld(auVar218,auVar18);
  auVar189 = pmulld(auVar204,auVar162);
  auVar111 = pmulld(auVar218,auVar162);
  auVar13 = pmulld(auVar204,auVar54);
  uVar212 = (uint)(iVar65 < local_248) * local_248 | (uint)(iVar65 >= local_248) * iVar65;
  uVar222 = (uint)(iVar74 < local_248) * local_248 | (uint)(iVar74 >= local_248) * iVar74;
  uVar225 = (uint)(iVar82 < local_248) * local_248 | (uint)(iVar82 >= local_248) * iVar82;
  uVar228 = (uint)(iVar90 < local_248) * local_248 | (uint)(iVar90 >= local_248) * iVar90;
  auVar44._0_4_ =
       (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  auVar44._4_4_ =
       (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  auVar44._8_4_ =
       (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  auVar44._12_4_ =
       (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  uVar212 = (uint)(iVar186 < local_248) * local_248 | (uint)(iVar186 >= local_248) * iVar186;
  uVar222 = (uint)(iVar196 < local_248) * local_248 | (uint)(iVar196 >= local_248) * iVar196;
  uVar225 = (uint)(iVar198 < local_248) * local_248 | (uint)(iVar198 >= local_248) * iVar198;
  uVar228 = (uint)(iVar200 < local_248) * local_248 | (uint)(iVar200 >= local_248) * iVar200;
  auVar123._0_4_ =
       (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  auVar123._4_4_ =
       (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  auVar123._8_4_ =
       (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  auVar123._12_4_ =
       (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  auVar204 = pmulld(auVar44,auVar18);
  auVar71 = pmulld(auVar123,auVar162);
  auVar100 = pmulld(auVar123,auVar54);
  auVar14 = pmulld(auVar44,auVar162);
  uVar212 = (uint)(iVar97 < local_248) * local_248 | (uint)(iVar97 >= local_248) * iVar97;
  uVar222 = (uint)(iVar103 < local_248) * local_248 | (uint)(iVar103 >= local_248) * iVar103;
  uVar225 = (uint)(iVar105 < local_248) * local_248 | (uint)(iVar105 >= local_248) * iVar105;
  uVar228 = (uint)(iVar107 < local_248) * local_248 | (uint)(iVar107 >= local_248) * iVar107;
  auVar122._0_4_ =
       (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  auVar122._4_4_ =
       (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  auVar122._8_4_ =
       (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  auVar122._12_4_ =
       (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  uVar212 = (uint)(iVar67 < local_248) * local_248 | (uint)(iVar67 >= local_248) * iVar67;
  uVar222 = (uint)(iVar76 < local_248) * local_248 | (uint)(iVar76 >= local_248) * iVar76;
  uVar225 = (uint)(iVar84 < local_248) * local_248 | (uint)(iVar84 >= local_248) * iVar84;
  uVar228 = (uint)(iVar92 < local_248) * local_248 | (uint)(iVar92 >= local_248) * iVar92;
  auVar153._0_4_ =
       (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  auVar153._4_4_ =
       (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  auVar153._8_4_ =
       (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  auVar153._12_4_ =
       (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  auVar120 = pmulld(auVar122,auVar55);
  auVar110 = pmulld(auVar153,auVar18);
  auVar98 = pmulld(auVar122,auVar18);
  auVar54 = pmulld(auVar153,auVar162);
  uVar212 = (uint)(iVar151 < local_248) * local_248 | (uint)(iVar151 >= local_248) * iVar151;
  uVar222 = (uint)(iVar155 < local_248) * local_248 | (uint)(iVar155 >= local_248) * iVar155;
  uVar225 = (uint)(iVar156 < local_248) * local_248 | (uint)(iVar156 >= local_248) * iVar156;
  uVar228 = (uint)(iVar157 < local_248) * local_248 | (uint)(iVar157 >= local_248) * iVar157;
  auVar137._0_4_ =
       (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  auVar137._4_4_ =
       (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  auVar137._8_4_ =
       (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  auVar137._12_4_ =
       (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  uVar212 = (uint)(iVar68 < local_248) * local_248 | (uint)(iVar68 >= local_248) * iVar68;
  uVar222 = (uint)(iVar77 < local_248) * local_248 | (uint)(iVar77 >= local_248) * iVar77;
  uVar225 = (uint)(iVar85 < local_248) * local_248 | (uint)(iVar85 >= local_248) * iVar85;
  uVar228 = (uint)(iVar93 < local_248) * local_248 | (uint)(iVar93 >= local_248) * iVar93;
  auVar215._0_4_ =
       (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  auVar215._4_4_ =
       (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  auVar215._8_4_ =
       (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  auVar215._12_4_ =
       (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  auVar55 = pmulld(auVar55,auVar137);
  auVar124 = pmulld(auVar215,auVar18);
  auVar153 = pmulld(auVar137,auVar18);
  auVar18 = pmulld(auVar215,auVar162);
  iVar69 = auVar161._0_4_ + iVar7 + auVar133._0_4_ >> auVar45;
  iVar74 = auVar161._4_4_ + iVar7 + auVar133._4_4_ >> auVar45;
  iVar75 = auVar161._8_4_ + iVar7 + auVar133._8_4_ >> auVar45;
  iVar76 = auVar161._12_4_ + iVar7 + auVar133._12_4_ >> auVar45;
  auVar12._4_4_ = auVar207._4_4_ + auVar206._4_4_;
  auVar12._0_4_ = auVar207._0_4_ + auVar206._0_4_;
  auVar12._8_4_ = auVar207._8_4_ + auVar206._8_4_;
  auVar12._12_4_ = auVar207._12_4_ + auVar206._12_4_;
  auVar12 = pmulld(auVar12,auVar57);
  iVar15 = auVar12._0_4_ + iVar7 >> auVar45;
  iVar25 = auVar12._4_4_ + iVar7 >> auVar45;
  iVar65 = auVar12._8_4_ + iVar7 >> auVar45;
  iVar67 = auVar12._12_4_ + iVar7 >> auVar45;
  iVar97 = iVar8 + iVar15;
  iVar103 = iVar72 + iVar25;
  iVar105 = iVar80 + iVar65;
  iVar107 = iVar88 + iVar67;
  iVar15 = iVar8 - iVar15;
  iVar25 = iVar72 - iVar25;
  iVar65 = iVar80 - iVar65;
  iVar67 = iVar88 - iVar67;
  iVar19 = iVar8 + iVar69;
  iVar33 = iVar72 + iVar74;
  iVar66 = iVar80 + iVar75;
  iVar68 = iVar88 + iVar76;
  iVar8 = iVar8 - iVar69;
  iVar72 = iVar72 - iVar74;
  iVar80 = iVar80 - iVar75;
  iVar88 = iVar88 - iVar76;
  uVar212 = (uint)(iVar173 < local_248) * local_248 | (uint)(iVar173 >= local_248) * iVar173;
  uVar222 = (uint)(iVar178 < local_248) * local_248 | (uint)(iVar178 >= local_248) * iVar178;
  uVar225 = (uint)(iVar181 < local_248) * local_248 | (uint)(iVar181 >= local_248) * iVar181;
  uVar228 = (uint)(iVar184 < local_248) * local_248 | (uint)(iVar184 >= local_248) * iVar184;
  auVar175._0_4_ =
       (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  auVar175._4_4_ =
       (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  auVar175._8_4_ =
       (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  auVar175._12_4_ =
       (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  uVar212 = (uint)(iVar42 < local_248) * local_248 | (uint)(iVar42 >= local_248) * iVar42;
  uVar222 = (uint)(iVar47 < local_248) * local_248 | (uint)(iVar47 >= local_248) * iVar47;
  uVar225 = (uint)(iVar49 < local_248) * local_248 | (uint)(iVar49 >= local_248) * iVar49;
  uVar228 = (uint)(iVar51 < local_248) * local_248 | (uint)(iVar51 >= local_248) * iVar51;
  auVar139._0_4_ =
       (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  auVar139._4_4_ =
       (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  auVar139._8_4_ =
       (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  auVar139._12_4_ =
       (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  auVar140._0_4_ = auVar139._0_4_ + auVar175._0_4_;
  auVar140._4_4_ = auVar139._4_4_ + auVar175._4_4_;
  auVar140._8_4_ = auVar139._8_4_ + auVar175._8_4_;
  auVar140._12_4_ = auVar139._12_4_ + auVar175._12_4_;
  auVar215 = pmulld(auVar175,auVar138);
  auVar12 = pmulld(auVar139,auVar57);
  uVar212 = (uint)(iVar158 < local_248) * local_248 | (uint)(iVar158 >= local_248) * iVar158;
  uVar222 = (uint)(iVar166 < local_248) * local_248 | (uint)(iVar166 >= local_248) * iVar166;
  uVar225 = (uint)(iVar168 < local_248) * local_248 | (uint)(iVar168 >= local_248) * iVar168;
  uVar228 = (uint)(iVar170 < local_248) * local_248 | (uint)(iVar170 >= local_248) * iVar170;
  auVar163._0_4_ =
       (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  auVar163._4_4_ =
       (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  auVar163._8_4_ =
       (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  auVar163._12_4_ =
       (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  uVar212 = (uint)(iVar172 < local_248) * local_248 | (uint)(iVar172 >= local_248) * iVar172;
  uVar222 = (uint)(iVar177 < local_248) * local_248 | (uint)(iVar177 >= local_248) * iVar177;
  uVar225 = (uint)(iVar180 < local_248) * local_248 | (uint)(iVar180 >= local_248) * iVar180;
  uVar228 = (uint)(iVar183 < local_248) * local_248 | (uint)(iVar183 >= local_248) * iVar183;
  auVar133._0_4_ =
       (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  auVar133._4_4_ =
       (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  auVar133._8_4_ =
       (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  auVar133._12_4_ =
       (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  local_478._4_4_ = auVar133._4_4_ + auVar163._4_4_;
  local_478._0_4_ = auVar133._0_4_ + auVar163._0_4_;
  local_478._8_4_ = auVar133._8_4_ + auVar163._8_4_;
  local_478._12_4_ = auVar133._12_4_ + auVar163._12_4_;
  auVar43 = pmulld(auVar163,auVar138);
  auVar44 = pmulld(auVar133,auVar57);
  uVar212 = (uint)(iVar130 < local_248) * local_248 | (uint)(iVar130 >= local_248) * iVar130;
  uVar222 = (uint)(iVar143 < local_248) * local_248 | (uint)(iVar143 >= local_248) * iVar143;
  uVar225 = (uint)(iVar146 < local_248) * local_248 | (uint)(iVar146 >= local_248) * iVar146;
  uVar228 = (uint)(iVar149 < local_248) * local_248 | (uint)(iVar149 >= local_248) * iVar149;
  uVar70 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uVar79 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  uVar87 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uVar95 = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  uVar212 = (uint)(iVar129 < local_248) * local_248 | (uint)(iVar129 >= local_248) * iVar129;
  uVar222 = (uint)(iVar142 < local_248) * local_248 | (uint)(iVar142 >= local_248) * iVar142;
  uVar225 = (uint)(iVar145 < local_248) * local_248 | (uint)(iVar145 >= local_248) * iVar145;
  uVar228 = (uint)(iVar148 < local_248) * local_248 | (uint)(iVar148 >= local_248) * iVar148;
  uVar212 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uVar222 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  uVar225 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uVar228 = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  iVar42 = uVar212 + uVar70;
  iVar47 = uVar222 + uVar79;
  iVar49 = uVar225 + uVar87;
  iVar51 = uVar228 + uVar95;
  iVar69 = uVar70 - uVar212;
  iVar75 = uVar79 - uVar222;
  iVar77 = uVar87 - uVar225;
  iVar82 = uVar95 - uVar228;
  uVar212 = (uint)(iVar42 < local_248) * local_248 | (uint)(iVar42 >= local_248) * iVar42;
  uVar222 = (uint)(iVar47 < local_248) * local_248 | (uint)(iVar47 >= local_248) * iVar47;
  uVar225 = (uint)(iVar49 < local_248) * local_248 | (uint)(iVar49 >= local_248) * iVar49;
  uVar228 = (uint)(iVar51 < local_248) * local_248 | (uint)(iVar51 >= local_248) * iVar51;
  uStack_134 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  local_138 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uStack_130 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uStack_12c = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  uVar212 = (uint)(iVar108 < local_248) * local_248 | (uint)(iVar108 >= local_248) * iVar108;
  uVar222 = (uint)(iVar113 < local_248) * local_248 | (uint)(iVar113 >= local_248) * iVar113;
  uVar225 = (uint)(iVar115 < local_248) * local_248 | (uint)(iVar115 >= local_248) * iVar115;
  uVar228 = (uint)(iVar117 < local_248) * local_248 | (uint)(iVar117 >= local_248) * iVar117;
  uVar70 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uVar79 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  uVar87 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uVar95 = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  uVar212 = (uint)(iVar16 < local_248) * local_248 | (uint)(iVar16 >= local_248) * iVar16;
  uVar222 = (uint)(iVar10 < local_248) * local_248 | (uint)(iVar10 >= local_248) * iVar10;
  uVar225 = (uint)(iVar26 < local_248) * local_248 | (uint)(iVar26 >= local_248) * iVar26;
  uVar228 = (uint)(iVar34 < local_248) * local_248 | (uint)(iVar34 >= local_248) * iVar34;
  uVar212 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uVar222 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  uVar225 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uVar228 = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  iVar42 = uVar212 + uVar70;
  iVar47 = uVar222 + uVar79;
  iVar49 = uVar225 + uVar87;
  iVar51 = uVar228 + uVar95;
  iVar74 = uVar70 - uVar212;
  iVar76 = uVar79 - uVar222;
  iVar78 = uVar87 - uVar225;
  iVar83 = uVar95 - uVar228;
  iVar91 = auVar56._0_4_ + iVar7 + auVar189._0_4_ >> auVar45;
  iVar92 = auVar56._4_4_ + iVar7 + auVar189._4_4_ >> auVar45;
  iVar93 = auVar56._8_4_ + iVar7 + auVar189._8_4_ >> auVar45;
  iVar94 = auVar56._12_4_ + iVar7 + auVar189._12_4_ >> auVar45;
  iVar16 = auVar55._0_4_ + iVar7 + auVar124._0_4_ >> auVar45;
  iVar10 = auVar55._4_4_ + iVar7 + auVar124._4_4_ >> auVar45;
  iVar26 = auVar55._8_4_ + iVar7 + auVar124._8_4_ >> auVar45;
  iVar34 = auVar55._12_4_ + iVar7 + auVar124._12_4_ >> auVar45;
  uVar212 = (uint)(iVar42 < local_248) * local_248 | (uint)(iVar42 >= local_248) * iVar42;
  uVar222 = (uint)(iVar47 < local_248) * local_248 | (uint)(iVar47 >= local_248) * iVar47;
  uVar225 = (uint)(iVar49 < local_248) * local_248 | (uint)(iVar49 >= local_248) * iVar49;
  uVar228 = (uint)(iVar51 < local_248) * local_248 | (uint)(iVar51 >= local_248) * iVar51;
  local_128 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uStack_124 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  uStack_120 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uStack_11c = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  iVar42 = iVar16 + iVar91;
  iVar47 = iVar10 + iVar92;
  iVar49 = iVar26 + iVar93;
  iVar51 = iVar34 + iVar94;
  iVar91 = iVar91 - iVar16;
  iVar92 = iVar92 - iVar10;
  iVar93 = iVar93 - iVar26;
  iVar94 = iVar94 - iVar34;
  iVar84 = auVar71._0_4_ + iVar7 + auVar204._0_4_ >> auVar45;
  iVar85 = auVar71._4_4_ + iVar7 + auVar204._4_4_ >> auVar45;
  iVar86 = auVar71._8_4_ + iVar7 + auVar204._8_4_ >> auVar45;
  iVar90 = auVar71._12_4_ + iVar7 + auVar204._12_4_ >> auVar45;
  uVar212 = (uint)(iVar42 < local_248) * local_248 | (uint)(iVar42 >= local_248) * iVar42;
  uVar222 = (uint)(iVar47 < local_248) * local_248 | (uint)(iVar47 >= local_248) * iVar47;
  uVar225 = (uint)(iVar49 < local_248) * local_248 | (uint)(iVar49 >= local_248) * iVar49;
  uVar228 = (uint)(iVar51 < local_248) * local_248 | (uint)(iVar51 >= local_248) * iVar51;
  local_118 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uStack_114 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  uStack_110 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uStack_10c = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  iVar42 = auVar110._0_4_ + iVar7 + auVar120._0_4_ >> auVar45;
  iVar47 = auVar110._4_4_ + iVar7 + auVar120._4_4_ >> auVar45;
  iVar49 = auVar110._8_4_ + iVar7 + auVar120._8_4_ >> auVar45;
  iVar51 = auVar110._12_4_ + iVar7 + auVar120._12_4_ >> auVar45;
  iVar16 = iVar42 + iVar84;
  iVar10 = iVar47 + iVar85;
  iVar26 = iVar49 + iVar86;
  iVar34 = iVar51 + iVar90;
  iVar84 = iVar84 - iVar42;
  iVar85 = iVar85 - iVar47;
  iVar86 = iVar86 - iVar49;
  iVar90 = iVar90 - iVar51;
  uVar212 = (uint)(iVar16 < local_248) * local_248 | (uint)(iVar16 >= local_248) * iVar16;
  uVar222 = (uint)(iVar10 < local_248) * local_248 | (uint)(iVar10 >= local_248) * iVar10;
  uVar225 = (uint)(iVar26 < local_248) * local_248 | (uint)(iVar26 >= local_248) * iVar26;
  uVar228 = (uint)(iVar34 < local_248) * local_248 | (uint)(iVar34 >= local_248) * iVar34;
  uStack_104 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  local_108 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uStack_100 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uStack_fc = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  uVar212 = (uint)(iVar17 < local_248) * local_248 | (uint)(iVar17 >= local_248) * iVar17;
  uVar222 = (uint)(iVar11 < local_248) * local_248 | (uint)(iVar11 >= local_248) * iVar11;
  uVar225 = (uint)(iVar27 < local_248) * local_248 | (uint)(iVar27 >= local_248) * iVar27;
  uVar228 = (uint)(iVar35 < local_248) * local_248 | (uint)(iVar35 >= local_248) * iVar35;
  uVar70 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uVar79 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  uVar87 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uVar95 = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  uVar212 = (uint)(iVar96 < local_248) * local_248 | (uint)(iVar96 >= local_248) * iVar96;
  uVar222 = (uint)(iVar102 < local_248) * local_248 | (uint)(iVar102 >= local_248) * iVar102;
  uVar225 = (uint)(iVar104 < local_248) * local_248 | (uint)(iVar104 >= local_248) * iVar104;
  uVar228 = (uint)(iVar106 < local_248) * local_248 | (uint)(iVar106 >= local_248) * iVar106;
  uVar212 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uVar222 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  uVar225 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uVar228 = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  iVar16 = uVar212 + uVar70;
  iVar17 = uVar222 + uVar79;
  iVar10 = uVar225 + uVar87;
  iVar11 = uVar228 + uVar95;
  iVar26 = uVar212 - uVar70;
  iVar27 = uVar222 - uVar79;
  iVar34 = uVar225 - uVar87;
  iVar35 = uVar228 - uVar95;
  uVar212 = (uint)(iVar16 < local_248) * local_248 | (uint)(iVar16 >= local_248) * iVar16;
  uVar222 = (uint)(iVar17 < local_248) * local_248 | (uint)(iVar17 >= local_248) * iVar17;
  uVar225 = (uint)(iVar10 < local_248) * local_248 | (uint)(iVar10 >= local_248) * iVar10;
  uVar228 = (uint)(iVar11 < local_248) * local_248 | (uint)(iVar11 >= local_248) * iVar11;
  uStack_44 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  local_48 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uStack_40 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uStack_3c = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  uVar212 = (uint)(iVar3 < local_248) * local_248 | (uint)(iVar3 >= local_248) * iVar3;
  uVar222 = (uint)(iVar20 < local_248) * local_248 | (uint)(iVar20 >= local_248) * iVar20;
  uVar225 = (uint)(iVar28 < local_248) * local_248 | (uint)(iVar28 >= local_248) * iVar28;
  uVar228 = (uint)(iVar36 < local_248) * local_248 | (uint)(iVar36 >= local_248) * iVar36;
  uVar212 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uVar222 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  uVar225 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uVar228 = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  uVar70 = (uint)(iVar41 < local_248) * local_248 | (uint)(iVar41 >= local_248) * iVar41;
  uVar79 = (uint)(iVar46 < local_248) * local_248 | (uint)(iVar46 >= local_248) * iVar46;
  uVar87 = (uint)(iVar48 < local_248) * local_248 | (uint)(iVar48 >= local_248) * iVar48;
  uVar95 = (uint)(iVar50 < local_248) * local_248 | (uint)(iVar50 >= local_248) * iVar50;
  uVar70 = (uint)(local_258 < (int)uVar70) * local_258 | (local_258 >= (int)uVar70) * uVar70;
  uVar79 = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  uVar87 = (uint)(local_258 < (int)uVar87) * local_258 | (local_258 >= (int)uVar87) * uVar87;
  uVar95 = (uint)(local_258 < (int)uVar95) * local_258 | (local_258 >= (int)uVar95) * uVar95;
  iVar16 = uVar212 + uVar70;
  iVar17 = uVar222 + uVar79;
  iVar3 = uVar225 + uVar87;
  iVar10 = uVar228 + uVar95;
  iVar41 = uVar70 - uVar212;
  iVar42 = uVar79 - uVar222;
  iVar46 = uVar87 - uVar225;
  iVar47 = uVar95 - uVar228;
  iVar96 = auVar111._0_4_ + iVar7 + auVar13._0_4_ >> auVar45;
  iVar102 = auVar111._4_4_ + iVar7 + auVar13._4_4_ >> auVar45;
  iVar104 = auVar111._8_4_ + iVar7 + auVar13._8_4_ >> auVar45;
  iVar106 = auVar111._12_4_ + iVar7 + auVar13._12_4_ >> auVar45;
  iVar11 = auVar153._0_4_ + iVar7 + auVar18._0_4_ >> auVar45;
  iVar20 = auVar153._4_4_ + iVar7 + auVar18._4_4_ >> auVar45;
  iVar28 = auVar153._8_4_ + iVar7 + auVar18._8_4_ >> auVar45;
  iVar36 = auVar153._12_4_ + iVar7 + auVar18._12_4_ >> auVar45;
  uVar212 = (uint)(iVar16 < local_248) * local_248 | (uint)(iVar16 >= local_248) * iVar16;
  uVar222 = (uint)(iVar17 < local_248) * local_248 | (uint)(iVar17 >= local_248) * iVar17;
  uVar225 = (uint)(iVar3 < local_248) * local_248 | (uint)(iVar3 >= local_248) * iVar3;
  uVar228 = (uint)(iVar10 < local_248) * local_248 | (uint)(iVar10 >= local_248) * iVar10;
  local_58 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uStack_54 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  uStack_50 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uStack_4c = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  iVar16 = iVar11 + iVar96;
  iVar17 = iVar20 + iVar102;
  iVar3 = iVar28 + iVar104;
  iVar10 = iVar36 + iVar106;
  iVar96 = iVar96 - iVar11;
  iVar102 = iVar102 - iVar20;
  iVar104 = iVar104 - iVar28;
  iVar106 = iVar106 - iVar36;
  iVar48 = auVar100._0_4_ + iVar7 + auVar14._0_4_ >> auVar45;
  iVar49 = auVar100._4_4_ + iVar7 + auVar14._4_4_ >> auVar45;
  iVar50 = auVar100._8_4_ + iVar7 + auVar14._8_4_ >> auVar45;
  iVar51 = auVar100._12_4_ + iVar7 + auVar14._12_4_ >> auVar45;
  uVar212 = (uint)(iVar16 < local_248) * local_248 | (uint)(iVar16 >= local_248) * iVar16;
  uVar222 = (uint)(iVar17 < local_248) * local_248 | (uint)(iVar17 >= local_248) * iVar17;
  uVar225 = (uint)(iVar3 < local_248) * local_248 | (uint)(iVar3 >= local_248) * iVar3;
  uVar228 = (uint)(iVar10 < local_248) * local_248 | (uint)(iVar10 >= local_248) * iVar10;
  local_68 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uStack_64 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  uStack_60 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uStack_5c = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  iVar11 = auVar54._0_4_ + iVar7 + auVar98._0_4_ >> auVar45;
  iVar20 = auVar54._4_4_ + iVar7 + auVar98._4_4_ >> auVar45;
  iVar28 = auVar54._8_4_ + iVar7 + auVar98._8_4_ >> auVar45;
  iVar36 = auVar54._12_4_ + iVar7 + auVar98._12_4_ >> auVar45;
  iVar16 = iVar11 + iVar48;
  iVar17 = iVar20 + iVar49;
  iVar3 = iVar28 + iVar50;
  iVar10 = iVar36 + iVar51;
  iVar48 = iVar48 - iVar11;
  iVar49 = iVar49 - iVar20;
  iVar50 = iVar50 - iVar28;
  iVar51 = iVar51 - iVar36;
  uVar212 = (uint)(iVar16 < local_248) * local_248 | (uint)(iVar16 >= local_248) * iVar16;
  uVar222 = (uint)(iVar17 < local_248) * local_248 | (uint)(iVar17 >= local_248) * iVar17;
  uVar225 = (uint)(iVar3 < local_248) * local_248 | (uint)(iVar3 >= local_248) * iVar3;
  uVar228 = (uint)(iVar10 < local_248) * local_248 | (uint)(iVar10 >= local_248) * iVar10;
  uStack_74 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  local_78 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uStack_70 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uStack_6c = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  uVar212 = (uint)(iVar64 < local_248) * local_248 | (uint)(iVar64 >= local_248) * iVar64;
  uVar222 = (uint)(iVar73 < local_248) * local_248 | (uint)(iVar73 >= local_248) * iVar73;
  uVar225 = (uint)(iVar81 < local_248) * local_248 | (uint)(iVar81 >= local_248) * iVar81;
  uVar228 = (uint)(iVar89 < local_248) * local_248 | (uint)(iVar89 >= local_248) * iVar89;
  uVar70 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uVar79 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  uVar87 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uVar95 = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  uVar212 = (uint)(iVar202 < local_248) * local_248 | (uint)(iVar202 >= local_248) * iVar202;
  uVar222 = (uint)(iVar208 < local_248) * local_248 | (uint)(iVar208 >= local_248) * iVar208;
  uVar225 = (uint)(iVar209 < local_248) * local_248 | (uint)(iVar209 >= local_248) * iVar209;
  uVar228 = (uint)(iVar210 < local_248) * local_248 | (uint)(iVar210 >= local_248) * iVar210;
  uVar212 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uVar222 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  uVar225 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uVar228 = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  iVar16 = uVar212 + uVar70;
  iVar17 = uVar222 + uVar79;
  iVar3 = uVar225 + uVar87;
  iVar10 = uVar228 + uVar95;
  iVar11 = uVar212 - uVar70;
  iVar20 = uVar222 - uVar79;
  iVar28 = uVar225 - uVar87;
  iVar36 = uVar228 - uVar95;
  uVar212 = (uint)(iVar16 < local_248) * local_248 | (uint)(iVar16 >= local_248) * iVar16;
  uVar222 = (uint)(iVar17 < local_248) * local_248 | (uint)(iVar17 >= local_248) * iVar17;
  uVar225 = (uint)(iVar3 < local_248) * local_248 | (uint)(iVar3 >= local_248) * iVar3;
  uVar228 = (uint)(iVar10 < local_248) * local_248 | (uint)(iVar10 >= local_248) * iVar10;
  local_238 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uStack_234 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  uStack_230 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uStack_22c = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  uVar212 = (uint)(iVar11 < local_248) * local_248 | (uint)(iVar11 >= local_248) * iVar11;
  uVar222 = (uint)(iVar20 < local_248) * local_248 | (uint)(iVar20 >= local_248) * iVar20;
  uVar225 = (uint)(iVar28 < local_248) * local_248 | (uint)(iVar28 >= local_248) * iVar28;
  uVar228 = (uint)(iVar36 < local_248) * local_248 | (uint)(iVar36 >= local_248) * iVar36;
  uStack_144 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  local_148 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uStack_140 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uStack_13c = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  uVar212 = (uint)(iVar211 < local_248) * local_248 | (uint)(iVar211 >= local_248) * iVar211;
  uVar222 = (uint)(iVar221 < local_248) * local_248 | (uint)(iVar221 >= local_248) * iVar221;
  uVar225 = (uint)(iVar224 < local_248) * local_248 | (uint)(iVar224 >= local_248) * iVar224;
  uVar228 = (uint)(iVar227 < local_248) * local_248 | (uint)(iVar227 >= local_248) * iVar227;
  uVar212 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uVar222 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  uVar225 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uVar228 = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  uVar70 = (uint)(iVar97 < local_248) * local_248 | (uint)(iVar97 >= local_248) * iVar97;
  uVar79 = (uint)(iVar103 < local_248) * local_248 | (uint)(iVar103 >= local_248) * iVar103;
  uVar87 = (uint)(iVar105 < local_248) * local_248 | (uint)(iVar105 >= local_248) * iVar105;
  uVar95 = (uint)(iVar107 < local_248) * local_248 | (uint)(iVar107 >= local_248) * iVar107;
  uVar70 = (uint)(local_258 < (int)uVar70) * local_258 | (local_258 >= (int)uVar70) * uVar70;
  uVar79 = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  uVar87 = (uint)(local_258 < (int)uVar87) * local_258 | (local_258 >= (int)uVar87) * uVar87;
  uVar95 = (uint)(local_258 < (int)uVar95) * local_258 | (local_258 >= (int)uVar95) * uVar95;
  iVar211 = uVar70 + uVar212;
  iVar221 = uVar79 + uVar222;
  iVar224 = uVar87 + uVar225;
  iVar227 = uVar95 + uVar228;
  iVar16 = uVar70 - uVar212;
  iVar17 = uVar79 - uVar222;
  iVar3 = uVar87 - uVar225;
  iVar10 = uVar95 - uVar228;
  uVar212 = (uint)(iVar211 < local_248) * local_248 | (uint)(iVar211 >= local_248) * iVar211;
  uVar222 = (uint)(iVar221 < local_248) * local_248 | (uint)(iVar221 >= local_248) * iVar221;
  uVar225 = (uint)(iVar224 < local_248) * local_248 | (uint)(iVar224 >= local_248) * iVar224;
  uVar228 = (uint)(iVar227 < local_248) * local_248 | (uint)(iVar227 >= local_248) * iVar227;
  local_228 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uStack_224 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  uStack_220 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uStack_21c = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  uVar212 = (uint)(iVar16 < local_248) * local_248 | (uint)(iVar16 >= local_248) * iVar16;
  uVar222 = (uint)(iVar17 < local_248) * local_248 | (uint)(iVar17 >= local_248) * iVar17;
  uVar225 = (uint)(iVar3 < local_248) * local_248 | (uint)(iVar3 >= local_248) * iVar3;
  uVar228 = (uint)(iVar10 < local_248) * local_248 | (uint)(iVar10 >= local_248) * iVar10;
  local_158 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uStack_154 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  uStack_150 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uStack_14c = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  uVar212 = (uint)(iVar19 < local_248) * local_248 | (uint)(iVar19 >= local_248) * iVar19;
  uVar222 = (uint)(iVar33 < local_248) * local_248 | (uint)(iVar33 >= local_248) * iVar33;
  uVar225 = (uint)(iVar66 < local_248) * local_248 | (uint)(iVar66 >= local_248) * iVar66;
  uVar228 = (uint)(iVar68 < local_248) * local_248 | (uint)(iVar68 >= local_248) * iVar68;
  auVar13 = pmulld(auVar140,auVar57);
  iVar224 = auVar13._0_4_ + iVar7 >> auVar45;
  iVar227 = auVar13._4_4_ + iVar7 >> auVar45;
  iVar16 = auVar13._8_4_ + iVar7 >> auVar45;
  iVar17 = auVar13._12_4_ + iVar7 >> auVar45;
  uVar212 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uVar222 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  uVar225 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uVar228 = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  iVar19 = iVar224 + uVar212;
  iVar33 = iVar227 + uVar222;
  iVar211 = iVar16 + uVar225;
  iVar221 = iVar17 + uVar228;
  iVar224 = uVar212 - iVar224;
  iVar227 = uVar222 - iVar227;
  iVar16 = uVar225 - iVar16;
  iVar17 = uVar228 - iVar17;
  uVar212 = (uint)(iVar19 < local_248) * local_248 | (uint)(iVar19 >= local_248) * iVar19;
  uVar222 = (uint)(iVar33 < local_248) * local_248 | (uint)(iVar33 >= local_248) * iVar33;
  uVar225 = (uint)(iVar211 < local_248) * local_248 | (uint)(iVar211 >= local_248) * iVar211;
  uVar228 = (uint)(iVar221 < local_248) * local_248 | (uint)(iVar221 >= local_248) * iVar221;
  local_218 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uStack_214 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  uStack_210 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uStack_20c = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  uVar212 = (uint)(iVar224 < local_248) * local_248 | (uint)(iVar224 >= local_248) * iVar224;
  uVar222 = (uint)(iVar227 < local_248) * local_248 | (uint)(iVar227 >= local_248) * iVar227;
  uVar225 = (uint)(iVar16 < local_248) * local_248 | (uint)(iVar16 >= local_248) * iVar16;
  uVar228 = (uint)(iVar17 < local_248) * local_248 | (uint)(iVar17 >= local_248) * iVar17;
  local_168 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uStack_164 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  uStack_160 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uStack_15c = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  uVar212 = (uint)(iVar4 < local_248) * local_248 | (uint)(iVar4 >= local_248) * iVar4;
  uVar222 = (uint)(iVar22 < local_248) * local_248 | (uint)(iVar22 >= local_248) * iVar22;
  uVar225 = (uint)(iVar30 < local_248) * local_248 | (uint)(iVar30 >= local_248) * iVar30;
  uVar228 = (uint)(iVar38 < local_248) * local_248 | (uint)(iVar38 >= local_248) * iVar38;
  uVar212 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uVar222 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  uVar225 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uVar228 = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  auVar13 = pmulld(local_478,auVar57);
  iVar224 = auVar13._0_4_ + iVar7 >> auVar45;
  iVar227 = auVar13._4_4_ + iVar7 >> auVar45;
  iVar16 = auVar13._8_4_ + iVar7 >> auVar45;
  iVar17 = auVar13._12_4_ + iVar7 >> auVar45;
  iVar19 = iVar224 + uVar212;
  iVar33 = iVar227 + uVar222;
  iVar211 = iVar16 + uVar225;
  iVar221 = iVar17 + uVar228;
  iVar224 = uVar212 - iVar224;
  iVar227 = uVar222 - iVar227;
  iVar16 = uVar225 - iVar16;
  iVar17 = uVar228 - iVar17;
  uVar212 = (uint)(iVar19 < local_248) * local_248 | (uint)(iVar19 >= local_248) * iVar19;
  uVar222 = (uint)(iVar33 < local_248) * local_248 | (uint)(iVar33 >= local_248) * iVar33;
  uVar225 = (uint)(iVar211 < local_248) * local_248 | (uint)(iVar211 >= local_248) * iVar211;
  uVar228 = (uint)(iVar221 < local_248) * local_248 | (uint)(iVar221 >= local_248) * iVar221;
  local_208 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uStack_204 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  uStack_200 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uStack_1fc = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  uVar212 = (uint)(iVar224 < local_248) * local_248 | (uint)(iVar224 >= local_248) * iVar224;
  uVar222 = (uint)(iVar227 < local_248) * local_248 | (uint)(iVar227 >= local_248) * iVar227;
  uVar225 = (uint)(iVar16 < local_248) * local_248 | (uint)(iVar16 >= local_248) * iVar16;
  uVar228 = (uint)(iVar17 < local_248) * local_248 | (uint)(iVar17 >= local_248) * iVar17;
  uStack_174 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  local_178 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uStack_170 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uStack_16c = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  uVar212 = (uint)(iVar52 < local_248) * local_248 | (uint)(iVar52 >= local_248) * iVar52;
  uVar222 = (uint)(iVar58 < local_248) * local_248 | (uint)(iVar58 >= local_248) * iVar58;
  uVar225 = (uint)(iVar60 < local_248) * local_248 | (uint)(iVar60 >= local_248) * iVar60;
  uVar228 = (uint)(iVar62 < local_248) * local_248 | (uint)(iVar62 >= local_248) * iVar62;
  iVar19 = auVar43._0_4_ + iVar7 + auVar44._0_4_ >> auVar45;
  iVar33 = auVar43._4_4_ + iVar7 + auVar44._4_4_ >> auVar45;
  iVar211 = auVar43._8_4_ + iVar7 + auVar44._8_4_ >> auVar45;
  iVar221 = auVar43._12_4_ + iVar7 + auVar44._12_4_ >> auVar45;
  uVar212 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uVar222 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  uVar225 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uVar228 = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  iVar224 = iVar19 + uVar212;
  iVar227 = iVar33 + uVar222;
  iVar16 = iVar211 + uVar225;
  iVar17 = iVar221 + uVar228;
  iVar19 = uVar212 - iVar19;
  iVar33 = uVar222 - iVar33;
  iVar211 = uVar225 - iVar211;
  iVar221 = uVar228 - iVar221;
  uVar212 = (uint)(iVar224 < local_248) * local_248 | (uint)(iVar224 >= local_248) * iVar224;
  uVar222 = (uint)(iVar227 < local_248) * local_248 | (uint)(iVar227 >= local_248) * iVar227;
  uVar225 = (uint)(iVar16 < local_248) * local_248 | (uint)(iVar16 >= local_248) * iVar16;
  uVar228 = (uint)(iVar17 < local_248) * local_248 | (uint)(iVar17 >= local_248) * iVar17;
  uStack_1f4 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  local_1f8 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uStack_1f0 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uStack_1ec = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  uVar212 = (uint)(iVar19 < local_248) * local_248 | (uint)(iVar19 >= local_248) * iVar19;
  uVar222 = (uint)(iVar33 < local_248) * local_248 | (uint)(iVar33 >= local_248) * iVar33;
  uVar225 = (uint)(iVar211 < local_248) * local_248 | (uint)(iVar211 >= local_248) * iVar211;
  uVar228 = (uint)(iVar221 < local_248) * local_248 | (uint)(iVar221 >= local_248) * iVar221;
  uStack_184 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  local_188 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uStack_180 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uStack_17c = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  uVar212 = (uint)(iVar8 < local_248) * local_248 | (uint)(iVar8 >= local_248) * iVar8;
  uVar222 = (uint)(iVar72 < local_248) * local_248 | (uint)(iVar72 >= local_248) * iVar72;
  uVar225 = (uint)(iVar80 < local_248) * local_248 | (uint)(iVar80 >= local_248) * iVar80;
  uVar228 = (uint)(iVar88 < local_248) * local_248 | (uint)(iVar88 >= local_248) * iVar88;
  uVar212 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uVar222 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  uVar225 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uVar228 = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  iVar224 = auVar215._0_4_ + iVar7 + auVar12._0_4_ >> auVar45;
  iVar227 = auVar215._4_4_ + iVar7 + auVar12._4_4_ >> auVar45;
  iVar16 = auVar215._8_4_ + iVar7 + auVar12._8_4_ >> auVar45;
  iVar17 = auVar215._12_4_ + iVar7 + auVar12._12_4_ >> auVar45;
  iVar19 = iVar224 + uVar212;
  iVar33 = iVar227 + uVar222;
  iVar211 = iVar16 + uVar225;
  iVar221 = iVar17 + uVar228;
  iVar224 = uVar212 - iVar224;
  iVar227 = uVar222 - iVar227;
  iVar16 = uVar225 - iVar16;
  iVar17 = uVar228 - iVar17;
  uVar212 = (uint)(iVar19 < local_248) * local_248 | (uint)(iVar19 >= local_248) * iVar19;
  uVar222 = (uint)(iVar33 < local_248) * local_248 | (uint)(iVar33 >= local_248) * iVar33;
  uVar225 = (uint)(iVar211 < local_248) * local_248 | (uint)(iVar211 >= local_248) * iVar211;
  uVar228 = (uint)(iVar221 < local_248) * local_248 | (uint)(iVar221 >= local_248) * iVar221;
  uStack_1e4 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  local_1e8 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uStack_1e0 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uStack_1dc = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  uVar212 = (uint)(iVar224 < local_248) * local_248 | (uint)(iVar224 >= local_248) * iVar224;
  uVar222 = (uint)(iVar227 < local_248) * local_248 | (uint)(iVar227 >= local_248) * iVar227;
  uVar225 = (uint)(iVar16 < local_248) * local_248 | (uint)(iVar16 >= local_248) * iVar16;
  uVar228 = (uint)(iVar17 < local_248) * local_248 | (uint)(iVar17 >= local_248) * iVar17;
  local_198 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uStack_194 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  uStack_190 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uStack_18c = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  uVar212 = (uint)(iVar6 < local_248) * local_248 | (uint)(iVar6 >= local_248) * iVar6;
  uVar222 = (uint)(iVar24 < local_248) * local_248 | (uint)(iVar24 >= local_248) * iVar24;
  uVar225 = (uint)(iVar32 < local_248) * local_248 | (uint)(iVar32 >= local_248) * iVar32;
  uVar228 = (uint)(iVar40 < local_248) * local_248 | (uint)(iVar40 >= local_248) * iVar40;
  uVar70 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uVar79 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  uVar87 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uVar95 = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  uVar212 = (uint)(iVar15 < local_248) * local_248 | (uint)(iVar15 >= local_248) * iVar15;
  uVar222 = (uint)(iVar25 < local_248) * local_248 | (uint)(iVar25 >= local_248) * iVar25;
  uVar225 = (uint)(iVar65 < local_248) * local_248 | (uint)(iVar65 >= local_248) * iVar65;
  uVar228 = (uint)(iVar67 < local_248) * local_248 | (uint)(iVar67 >= local_248) * iVar67;
  uVar212 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uVar222 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  uVar225 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uVar228 = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  iVar15 = uVar212 + uVar70;
  iVar19 = uVar222 + uVar79;
  iVar25 = uVar225 + uVar87;
  iVar33 = uVar228 + uVar95;
  iVar211 = uVar212 - uVar70;
  iVar221 = uVar222 - uVar79;
  iVar224 = uVar225 - uVar87;
  iVar227 = uVar228 - uVar95;
  uVar212 = (uint)(iVar15 < local_248) * local_248 | (uint)(iVar15 >= local_248) * iVar15;
  uVar222 = (uint)(iVar19 < local_248) * local_248 | (uint)(iVar19 >= local_248) * iVar19;
  uVar225 = (uint)(iVar25 < local_248) * local_248 | (uint)(iVar25 >= local_248) * iVar25;
  uVar228 = (uint)(iVar33 < local_248) * local_248 | (uint)(iVar33 >= local_248) * iVar33;
  uStack_1d4 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  local_1d8 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uStack_1d0 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uStack_1cc = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  uVar212 = (uint)(iVar211 < local_248) * local_248 | (uint)(iVar211 >= local_248) * iVar211;
  uVar222 = (uint)(iVar221 < local_248) * local_248 | (uint)(iVar221 >= local_248) * iVar221;
  uVar225 = (uint)(iVar224 < local_248) * local_248 | (uint)(iVar224 >= local_248) * iVar224;
  uVar228 = (uint)(iVar227 < local_248) * local_248 | (uint)(iVar227 >= local_248) * iVar227;
  local_1a8 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uStack_1a4 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  uStack_1a0 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uStack_19c = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  uVar212 = (uint)(iVar5 < local_248) * local_248 | (uint)(iVar5 >= local_248) * iVar5;
  uVar222 = (uint)(iVar23 < local_248) * local_248 | (uint)(iVar23 >= local_248) * iVar23;
  uVar225 = (uint)(iVar31 < local_248) * local_248 | (uint)(iVar31 >= local_248) * iVar31;
  uVar228 = (uint)(iVar39 < local_248) * local_248 | (uint)(iVar39 >= local_248) * iVar39;
  uVar70 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uVar79 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  uVar87 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uVar95 = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  uVar212 = (uint)(iVar2 < local_248) * local_248 | (uint)(iVar2 >= local_248) * iVar2;
  uVar222 = (uint)(iVar21 < local_248) * local_248 | (uint)(iVar21 >= local_248) * iVar21;
  uVar225 = (uint)(iVar29 < local_248) * local_248 | (uint)(iVar29 >= local_248) * iVar29;
  uVar228 = (uint)(iVar37 < local_248) * local_248 | (uint)(iVar37 >= local_248) * iVar37;
  uVar212 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uVar222 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  uVar225 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uVar228 = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  iVar15 = uVar212 + uVar70;
  iVar19 = uVar222 + uVar79;
  iVar25 = uVar225 + uVar87;
  iVar33 = uVar228 + uVar95;
  iVar211 = uVar212 - uVar70;
  iVar221 = uVar222 - uVar79;
  iVar224 = uVar225 - uVar87;
  iVar227 = uVar228 - uVar95;
  uVar131 = (uint)(iVar69 < local_248) * local_248 | (uint)(iVar69 >= local_248) * iVar69;
  uVar144 = (uint)(iVar75 < local_248) * local_248 | (uint)(iVar75 >= local_248) * iVar75;
  uVar147 = (uint)(iVar77 < local_248) * local_248 | (uint)(iVar77 >= local_248) * iVar77;
  uVar150 = (uint)(iVar82 < local_248) * local_248 | (uint)(iVar82 >= local_248) * iVar82;
  uVar119 = (uint)(iVar74 < local_248) * local_248 | (uint)(iVar74 >= local_248) * iVar74;
  uVar126 = (uint)(iVar76 < local_248) * local_248 | (uint)(iVar76 >= local_248) * iVar76;
  uVar127 = (uint)(iVar78 < local_248) * local_248 | (uint)(iVar78 >= local_248) * iVar78;
  uVar128 = (uint)(iVar83 < local_248) * local_248 | (uint)(iVar83 >= local_248) * iVar83;
  uVar174 = (uint)(iVar91 < local_248) * local_248 | (uint)(iVar91 >= local_248) * iVar91;
  uVar179 = (uint)(iVar92 < local_248) * local_248 | (uint)(iVar92 >= local_248) * iVar92;
  uVar182 = (uint)(iVar93 < local_248) * local_248 | (uint)(iVar93 >= local_248) * iVar93;
  uVar185 = (uint)(iVar94 < local_248) * local_248 | (uint)(iVar94 >= local_248) * iVar94;
  uVar109 = (uint)(iVar84 < local_248) * local_248 | (uint)(iVar84 >= local_248) * iVar84;
  uVar114 = (uint)(iVar85 < local_248) * local_248 | (uint)(iVar85 >= local_248) * iVar85;
  uVar116 = (uint)(iVar86 < local_248) * local_248 | (uint)(iVar86 >= local_248) * iVar86;
  uVar118 = (uint)(iVar90 < local_248) * local_248 | (uint)(iVar90 >= local_248) * iVar90;
  uVar53 = (uint)(iVar26 < local_248) * local_248 | (uint)(iVar26 >= local_248) * iVar26;
  uVar59 = (uint)(iVar27 < local_248) * local_248 | (uint)(iVar27 >= local_248) * iVar27;
  uVar61 = (uint)(iVar34 < local_248) * local_248 | (uint)(iVar34 >= local_248) * iVar34;
  uVar63 = (uint)(iVar35 < local_248) * local_248 | (uint)(iVar35 >= local_248) * iVar35;
  uVar159 = (uint)(iVar41 < local_248) * local_248 | (uint)(iVar41 >= local_248) * iVar41;
  uVar167 = (uint)(iVar42 < local_248) * local_248 | (uint)(iVar42 >= local_248) * iVar42;
  uVar169 = (uint)(iVar46 < local_248) * local_248 | (uint)(iVar46 >= local_248) * iVar46;
  uVar171 = (uint)(iVar47 < local_248) * local_248 | (uint)(iVar47 >= local_248) * iVar47;
  uVar213 = (uint)(iVar96 < local_248) * local_248 | (uint)(iVar96 >= local_248) * iVar96;
  uVar223 = (uint)(iVar102 < local_248) * local_248 | (uint)(iVar102 >= local_248) * iVar102;
  uVar226 = (uint)(iVar104 < local_248) * local_248 | (uint)(iVar104 >= local_248) * iVar104;
  uVar229 = (uint)(iVar106 < local_248) * local_248 | (uint)(iVar106 >= local_248) * iVar106;
  uVar187 = (uint)(iVar48 < local_248) * local_248 | (uint)(iVar48 >= local_248) * iVar48;
  uVar197 = (uint)(iVar49 < local_248) * local_248 | (uint)(iVar49 >= local_248) * iVar49;
  uVar199 = (uint)(iVar50 < local_248) * local_248 | (uint)(iVar50 >= local_248) * iVar50;
  uVar201 = (uint)(iVar51 < local_248) * local_248 | (uint)(iVar51 >= local_248) * iVar51;
  uVar212 = (uint)(iVar15 < local_248) * local_248 | (uint)(iVar15 >= local_248) * iVar15;
  uVar222 = (uint)(iVar19 < local_248) * local_248 | (uint)(iVar19 >= local_248) * iVar19;
  uVar225 = (uint)(iVar25 < local_248) * local_248 | (uint)(iVar25 >= local_248) * iVar25;
  uVar228 = (uint)(iVar33 < local_248) * local_248 | (uint)(iVar33 >= local_248) * iVar33;
  uVar70 = (uint)(iVar211 < local_248) * local_248 | (uint)(iVar211 >= local_248) * iVar211;
  uVar79 = (uint)(iVar221 < local_248) * local_248 | (uint)(iVar221 >= local_248) * iVar221;
  uVar87 = (uint)(iVar224 < local_248) * local_248 | (uint)(iVar224 >= local_248) * iVar224;
  uVar95 = (uint)(iVar227 < local_248) * local_248 | (uint)(iVar227 >= local_248) * iVar227;
  auVar141._0_4_ =
       (uint)(local_258 < (int)uVar131) * local_258 | (local_258 >= (int)uVar131) * uVar131;
  auVar141._4_4_ =
       (uint)(local_258 < (int)uVar144) * local_258 | (local_258 >= (int)uVar144) * uVar144;
  auVar141._8_4_ =
       (uint)(local_258 < (int)uVar147) * local_258 | (local_258 >= (int)uVar147) * uVar147;
  auVar141._12_4_ =
       (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  auVar125._0_4_ =
       (uint)(local_258 < (int)uVar119) * local_258 | (local_258 >= (int)uVar119) * uVar119;
  auVar125._4_4_ =
       (uint)(local_258 < (int)uVar126) * local_258 | (local_258 >= (int)uVar126) * uVar126;
  auVar125._8_4_ =
       (uint)(local_258 < (int)uVar127) * local_258 | (local_258 >= (int)uVar127) * uVar127;
  auVar125._12_4_ =
       (uint)(local_258 < (int)uVar128) * local_258 | (local_258 >= (int)uVar128) * uVar128;
  auVar176._0_4_ =
       (uint)(local_258 < (int)uVar174) * local_258 | (local_258 >= (int)uVar174) * uVar174;
  auVar176._4_4_ =
       (uint)(local_258 < (int)uVar179) * local_258 | (local_258 >= (int)uVar179) * uVar179;
  auVar176._8_4_ =
       (uint)(local_258 < (int)uVar182) * local_258 | (local_258 >= (int)uVar182) * uVar182;
  auVar176._12_4_ =
       (uint)(local_258 < (int)uVar185) * local_258 | (local_258 >= (int)uVar185) * uVar185;
  auVar192._0_4_ =
       (uint)(local_258 < (int)uVar109) * local_258 | (local_258 >= (int)uVar109) * uVar109;
  auVar192._4_4_ =
       (uint)(local_258 < (int)uVar114) * local_258 | (local_258 >= (int)uVar114) * uVar114;
  auVar192._8_4_ =
       (uint)(local_258 < (int)uVar116) * local_258 | (local_258 >= (int)uVar116) * uVar116;
  auVar192._12_4_ =
       (uint)(local_258 < (int)uVar118) * local_258 | (local_258 >= (int)uVar118) * uVar118;
  auVar110._0_4_ = (uint)(local_258 < (int)uVar53) * local_258 | (local_258 >= (int)uVar53) * uVar53
  ;
  auVar110._4_4_ = (uint)(local_258 < (int)uVar59) * local_258 | (local_258 >= (int)uVar59) * uVar59
  ;
  auVar110._8_4_ = (uint)(local_258 < (int)uVar61) * local_258 | (local_258 >= (int)uVar61) * uVar61
  ;
  auVar110._12_4_ =
       (uint)(local_258 < (int)uVar63) * local_258 | (local_258 >= (int)uVar63) * uVar63;
  auVar164._0_4_ =
       (uint)(local_258 < (int)uVar159) * local_258 | (local_258 >= (int)uVar159) * uVar159;
  auVar164._4_4_ =
       (uint)(local_258 < (int)uVar167) * local_258 | (local_258 >= (int)uVar167) * uVar167;
  auVar164._8_4_ =
       (uint)(local_258 < (int)uVar169) * local_258 | (local_258 >= (int)uVar169) * uVar169;
  auVar164._12_4_ =
       (uint)(local_258 < (int)uVar171) * local_258 | (local_258 >= (int)uVar171) * uVar171;
  auVar219._0_4_ =
       (uint)(local_258 < (int)uVar213) * local_258 | (local_258 >= (int)uVar213) * uVar213;
  auVar219._4_4_ =
       (uint)(local_258 < (int)uVar223) * local_258 | (local_258 >= (int)uVar223) * uVar223;
  auVar219._8_4_ =
       (uint)(local_258 < (int)uVar226) * local_258 | (local_258 >= (int)uVar226) * uVar226;
  auVar219._12_4_ =
       (uint)(local_258 < (int)uVar229) * local_258 | (local_258 >= (int)uVar229) * uVar229;
  auVar194._0_4_ =
       (uint)(local_258 < (int)uVar187) * local_258 | (local_258 >= (int)uVar187) * uVar187;
  auVar194._4_4_ =
       (uint)(local_258 < (int)uVar197) * local_258 | (local_258 >= (int)uVar197) * uVar197;
  auVar194._8_4_ =
       (uint)(local_258 < (int)uVar199) * local_258 | (local_258 >= (int)uVar199) * uVar199;
  auVar194._12_4_ =
       (uint)(local_258 < (int)uVar201) * local_258 | (local_258 >= (int)uVar201) * uVar201;
  uStack_1c4 = (uint)(local_258 < (int)uVar222) * local_258 | (local_258 >= (int)uVar222) * uVar222;
  local_1c8 = (uint)(local_258 < (int)uVar212) * local_258 | (local_258 >= (int)uVar212) * uVar212;
  uStack_1c0 = (uint)(local_258 < (int)uVar225) * local_258 | (local_258 >= (int)uVar225) * uVar225;
  uStack_1bc = (uint)(local_258 < (int)uVar228) * local_258 | (local_258 >= (int)uVar228) * uVar228;
  uStack_1b4 = (uint)(local_258 < (int)uVar79) * local_258 | (local_258 >= (int)uVar79) * uVar79;
  local_1b8 = (uint)(local_258 < (int)uVar70) * local_258 | (local_258 >= (int)uVar70) * uVar70;
  uStack_1b0 = (uint)(local_258 < (int)uVar87) * local_258 | (local_258 >= (int)uVar87) * uVar87;
  uStack_1ac = (uint)(local_258 < (int)uVar95) * local_258 | (local_258 >= (int)uVar95) * uVar95;
  auVar195._0_4_ = auVar194._0_4_ + auVar192._0_4_;
  auVar195._4_4_ = auVar194._4_4_ + auVar192._4_4_;
  auVar195._8_4_ = auVar194._8_4_ + auVar192._8_4_;
  auVar195._12_4_ = auVar194._12_4_ + auVar192._12_4_;
  auVar13 = pmulld(auVar192,auVar138);
  auVar12 = pmulld(auVar194,auVar57);
  auVar18 = pmulld(auVar195,auVar57);
  iStack_84 = auVar18._4_4_ + iVar7 >> auVar45;
  local_88 = auVar18._0_4_ + iVar7 >> auVar45;
  iStack_80 = auVar18._8_4_ + iVar7 >> auVar45;
  iStack_7c = auVar18._12_4_ + iVar7 >> auVar45;
  iStack_f4 = auVar13._4_4_ + iVar7 + auVar12._4_4_ >> auVar45;
  local_f8 = auVar13._0_4_ + iVar7 + auVar12._0_4_ >> auVar45;
  iStack_f0 = auVar13._8_4_ + iVar7 + auVar12._8_4_ >> auVar45;
  iStack_ec = auVar13._12_4_ + iVar7 + auVar12._12_4_ >> auVar45;
  auVar220._0_4_ = auVar219._0_4_ + auVar176._0_4_;
  auVar220._4_4_ = auVar219._4_4_ + auVar176._4_4_;
  auVar220._8_4_ = auVar219._8_4_ + auVar176._8_4_;
  auVar220._12_4_ = auVar219._12_4_ + auVar176._12_4_;
  auVar13 = pmulld(auVar176,auVar138);
  auVar12 = pmulld(auVar219,auVar57);
  auVar18 = pmulld(auVar220,auVar57);
  local_98 = auVar18._0_4_ + iVar7 >> auVar45;
  iStack_94 = auVar18._4_4_ + iVar7 >> auVar45;
  iStack_90 = auVar18._8_4_ + iVar7 >> auVar45;
  iStack_8c = auVar18._12_4_ + iVar7 >> auVar45;
  local_e8 = auVar13._0_4_ + iVar7 + auVar12._0_4_ >> auVar45;
  iStack_e4 = auVar13._4_4_ + iVar7 + auVar12._4_4_ >> auVar45;
  iStack_e0 = auVar13._8_4_ + iVar7 + auVar12._8_4_ >> auVar45;
  iStack_dc = auVar13._12_4_ + iVar7 + auVar12._12_4_ >> auVar45;
  auVar165._0_4_ = auVar164._0_4_ + auVar125._0_4_;
  auVar165._4_4_ = auVar164._4_4_ + auVar125._4_4_;
  auVar165._8_4_ = auVar164._8_4_ + auVar125._8_4_;
  auVar165._12_4_ = auVar164._12_4_ + auVar125._12_4_;
  auVar13 = pmulld(auVar125,auVar138);
  auVar12 = pmulld(auVar164,auVar57);
  local_d8 = auVar13._0_4_ + iVar7 + auVar12._0_4_ >> auVar45;
  iStack_d4 = auVar13._4_4_ + iVar7 + auVar12._4_4_ >> auVar45;
  iStack_d0 = auVar13._8_4_ + iVar7 + auVar12._8_4_ >> auVar45;
  iStack_cc = auVar13._12_4_ + iVar7 + auVar12._12_4_ >> auVar45;
  auVar12 = pmulld(auVar165,auVar57);
  local_a8 = auVar12._0_4_ + iVar7 >> auVar45;
  iStack_a4 = auVar12._4_4_ + iVar7 >> auVar45;
  iStack_a0 = auVar12._8_4_ + iVar7 >> auVar45;
  iStack_9c = auVar12._12_4_ + iVar7 >> auVar45;
  auVar13 = pmulld(auVar138,auVar141);
  auVar12 = pmulld(auVar110,auVar57);
  auVar111._0_4_ = auVar110._0_4_ + auVar141._0_4_;
  auVar111._4_4_ = auVar110._4_4_ + auVar141._4_4_;
  auVar111._8_4_ = auVar110._8_4_ + auVar141._8_4_;
  auVar111._12_4_ = auVar110._12_4_ + auVar141._12_4_;
  auVar18 = pmulld(auVar111,auVar57);
  iStack_b4 = auVar18._4_4_ + iVar7 >> auVar45;
  local_b8 = auVar18._0_4_ + iVar7 >> auVar45;
  iStack_b0 = auVar18._8_4_ + iVar7 >> auVar45;
  iStack_ac = auVar18._12_4_ + iVar7 >> auVar45;
  iStack_c4 = auVar12._4_4_ + iVar7 + auVar13._4_4_ >> auVar45;
  local_c8 = auVar12._0_4_ + iVar7 + auVar13._0_4_ >> auVar45;
  iStack_c0 = auVar12._8_4_ + iVar7 + auVar13._8_4_ >> auVar45;
  iStack_bc = auVar12._12_4_ + iVar7 + auVar13._12_4_ >> auVar45;
  iStack_254 = local_258;
  iStack_250 = local_258;
  iStack_24c = local_258;
  iStack_244 = local_248;
  iStack_240 = local_248;
  iStack_23c = local_248;
  idct32_stage9_sse4_1
            ((__m128i *)&local_238,out,do_cols,bd,out_shift,(__m128i *)&local_248,
             (__m128i *)&local_258);
  return;
}

Assistant:

static void idct32x32_low8_sse4_1(__m128i *in, __m128i *out, int bit,
                                  int do_cols, int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi62 = _mm_set1_epi32(cospi[62]);
  const __m128i cospi14 = _mm_set1_epi32(cospi[14]);
  const __m128i cospi54 = _mm_set1_epi32(cospi[54]);
  const __m128i cospi6 = _mm_set1_epi32(cospi[6]);
  const __m128i cospi10 = _mm_set1_epi32(cospi[10]);
  const __m128i cospi2 = _mm_set1_epi32(cospi[2]);
  const __m128i cospim58 = _mm_set1_epi32(-cospi[58]);
  const __m128i cospim50 = _mm_set1_epi32(-cospi[50]);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospi12 = _mm_set1_epi32(cospi[12]);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospim52 = _mm_set1_epi32(-cospi[52]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospim40 = _mm_set1_epi32(-cospi[40]);
  const __m128i cospim8 = _mm_set1_epi32(-cospi[8]);
  const __m128i cospim56 = _mm_set1_epi32(-cospi[56]);
  const __m128i cospim24 = _mm_set1_epi32(-cospi[24]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospim32 = _mm_set1_epi32(-cospi[32]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i rounding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i bf1[32];

  // stage 0
  // stage 1
  bf1[0] = in[0];
  bf1[4] = in[4];
  bf1[8] = in[2];
  bf1[12] = in[6];
  bf1[16] = in[1];
  bf1[20] = in[5];
  bf1[24] = in[3];
  bf1[28] = in[7];

  // stage 2
  bf1[31] = half_btf_0_sse4_1(&cospi2, &bf1[16], &rounding, bit);
  bf1[16] = half_btf_0_sse4_1(&cospi62, &bf1[16], &rounding, bit);
  bf1[19] = half_btf_0_sse4_1(&cospim50, &bf1[28], &rounding, bit);
  bf1[28] = half_btf_0_sse4_1(&cospi14, &bf1[28], &rounding, bit);
  bf1[27] = half_btf_0_sse4_1(&cospi10, &bf1[20], &rounding, bit);
  bf1[20] = half_btf_0_sse4_1(&cospi54, &bf1[20], &rounding, bit);
  bf1[23] = half_btf_0_sse4_1(&cospim58, &bf1[24], &rounding, bit);
  bf1[24] = half_btf_0_sse4_1(&cospi6, &bf1[24], &rounding, bit);

  // stage 3
  bf1[15] = half_btf_0_sse4_1(&cospi4, &bf1[8], &rounding, bit);
  bf1[8] = half_btf_0_sse4_1(&cospi60, &bf1[8], &rounding, bit);

  bf1[11] = half_btf_0_sse4_1(&cospim52, &bf1[12], &rounding, bit);
  bf1[12] = half_btf_0_sse4_1(&cospi12, &bf1[12], &rounding, bit);
  bf1[17] = bf1[16];
  bf1[18] = bf1[19];
  bf1[21] = bf1[20];
  bf1[22] = bf1[23];
  bf1[25] = bf1[24];
  bf1[26] = bf1[27];
  bf1[29] = bf1[28];
  bf1[30] = bf1[31];

  // stage 4 :
  bf1[7] = half_btf_0_sse4_1(&cospi8, &bf1[4], &rounding, bit);
  bf1[4] = half_btf_0_sse4_1(&cospi56, &bf1[4], &rounding, bit);

  bf1[9] = bf1[8];
  bf1[10] = bf1[11];
  bf1[13] = bf1[12];
  bf1[14] = bf1[15];

  idct32_stage4_sse4_1(bf1, &cospim8, &cospi56, &cospi8, &cospim56, &cospim40,
                       &cospi24, &cospi40, &cospim24, &rounding, bit);

  // stage 5
  bf1[0] = half_btf_0_sse4_1(&cospi32, &bf1[0], &rounding, bit);
  bf1[1] = bf1[0];
  bf1[5] = bf1[4];
  bf1[6] = bf1[7];

  idct32_stage5_sse4_1(bf1, &cospim16, &cospi48, &cospi16, &cospim48, &clamp_lo,
                       &clamp_hi, &rounding, bit);

  // stage 6
  bf1[3] = bf1[0];
  bf1[2] = bf1[1];

  idct32_stage6_sse4_1(bf1, &cospim32, &cospi32, &cospim16, &cospi48, &cospi16,
                       &cospim48, &clamp_lo, &clamp_hi, &rounding, bit);

  // stage 7
  idct32_stage7_sse4_1(bf1, &cospim32, &cospi32, &clamp_lo, &clamp_hi,
                       &rounding, bit);

  // stage 8
  idct32_stage8_sse4_1(bf1, &cospim32, &cospi32, &clamp_lo, &clamp_hi,
                       &rounding, bit);

  // stage 9
  idct32_stage9_sse4_1(bf1, out, do_cols, bd, out_shift, &clamp_lo, &clamp_hi);
}